

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdataurl.cpp
# Opt level: O2

bool qDecodeDataUrl(QUrl *uri,QString *mimeType,QByteArray *payload)

{
  qsizetype qVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  qsizetype qVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QByteArrayView QVar9;
  QLatin1String local_b8;
  QByteArrayView local_a0;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QUrl::scheme((QString *)&local_58,uri);
  local_90.d = (Data *)0x4;
  local_90.ptr = L"data";
  bVar5 = operator!=((QString *)&local_58,(QLatin1StringView *)&local_90);
  bVar8 = true;
  if (!bVar5) {
    QUrl::host((QString *)&local_78,uri,(ComponentFormattingOptions)0x7f00000);
    bVar8 = local_78.size != 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (bVar8 == false) {
    local_78._0_16_ = ZEXT816(0);
    local_78.size = 0;
    local_58.d = (mimeType->d).d;
    local_58.ptr = (mimeType->d).ptr;
    (mimeType->d).d = (Data *)0x0;
    (mimeType->d).ptr = L"text/plain;charset=US-ASCII";
    local_58.size = (mimeType->d).size;
    (mimeType->d).size = 0x1b;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QUrl::url((QString *)&local_90,uri,(FormattingOptions)0x1f00001);
    QString::toLatin1_helper_inplace((QByteArray *)&local_78,(QString *)&local_90);
    QByteArray::fromPercentEncoding((QByteArray *)&local_58,(QByteArray *)&local_78,'%');
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
    local_a0.m_data = (storage_type *)local_58.ptr;
    local_a0.m_size = local_58.size;
    qVar6 = QByteArrayView::indexOf(&local_a0,',',0);
    if (qVar6 != -1) {
      QVar9 = QByteArrayView::mid(&local_a0,qVar6 + 1,-1);
      local_90.d = (Data *)QVar9.m_size;
      local_90.ptr = (char16_t *)QVar9.m_data;
      QByteArrayView::toByteArray((QByteArray *)&local_78,(QByteArrayView *)&local_90);
      auVar2._0_8_ = (payload->d).d;
      auVar2._8_8_ = (payload->d).ptr;
      (payload->d).d = (Data *)local_78.d;
      (payload->d).ptr = (char *)local_78.ptr;
      qVar1 = (payload->d).size;
      (payload->d).size = local_78.size;
      local_78._0_16_ = auVar2;
      local_78.size = qVar1;
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
      local_a0.m_size = qVar6;
      local_a0 = QByteArrayView::trimmed(&local_a0);
      s.m_data = ";base64";
      s.m_size = 7;
      local_78._0_16_ = local_a0;
      bVar5 = QLatin1String::endsWith((QLatin1String *)&local_78,s,CaseInsensitive);
      if (bVar5) {
        QByteArray::fromBase64((QByteArray *)&local_78,payload,(Base64Options)0x0);
        auVar3._0_8_ = (payload->d).d;
        auVar3._8_8_ = (payload->d).ptr;
        (payload->d).d = (Data *)local_78.d;
        (payload->d).ptr = (char *)local_78.ptr;
        qVar6 = (payload->d).size;
        (payload->d).size = local_78.size;
        local_78._0_16_ = auVar3;
        local_78.size = qVar6;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_78);
        local_78.d = (Data *)(local_a0.m_size + -7);
        local_a0.m_size = (qsizetype)local_78.d;
      }
      else {
        local_78.d = (Data *)local_a0.m_size;
      }
      local_b8.m_size = 0;
      local_b8.m_data = (char *)0x0;
      local_78.ptr = (char16_t *)local_a0.m_data;
      s_00.m_data = "charset";
      s_00.m_size = 7;
      bVar5 = QLatin1String::startsWith((QLatin1String *)&local_78,s_00,CaseInsensitive);
      if (bVar5) {
        for (pcVar7 = local_a0.m_data + 7; *pcVar7 == ' '; pcVar7 = pcVar7 + 1) {
        }
        if (*pcVar7 == '=') {
          local_b8.m_size = 0xb;
          local_b8.m_data = "text/plain;";
        }
      }
      if (local_a0.m_size != 0) {
        QVar9 = QByteArrayView::trimmed(&local_a0);
        local_90.ptr = (char16_t *)QVar9.m_size;
        local_90.size = (qsizetype)QVar9.m_data;
        local_90.d = (Data *)&local_b8;
        QStringBuilder<QLatin1String_&,_QLatin1String>::convertTo<QString>
                  ((QString *)&local_78,(QStringBuilder<QLatin1String_&,_QLatin1String> *)&local_90)
        ;
        auVar4._0_8_ = (mimeType->d).d;
        auVar4._8_8_ = (mimeType->d).ptr;
        (mimeType->d).d = local_78.d;
        (mimeType->d).ptr = local_78.ptr;
        qVar6 = (mimeType->d).size;
        (mimeType->d).size = local_78.size;
        local_78._0_16_ = auVar4;
        local_78.size = qVar6;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)(bVar8 ^ 1);
  }
  __stack_chk_fail();
}

Assistant:

Q_CORE_EXPORT bool qDecodeDataUrl(const QUrl &uri, QString &mimeType, QByteArray &payload)
{
    if (uri.scheme() != "data"_L1 || !uri.host().isEmpty())
        return false;

    mimeType = QStringLiteral("text/plain;charset=US-ASCII");

    // the following would have been the correct thing, but
    // reality often differs from the specification. People have
    // data: URIs with ? and #
    //QByteArray data = QByteArray::fromPercentEncoding(uri.path(QUrl::FullyEncoded).toLatin1());
    const QByteArray dataArray =
            QByteArray::fromPercentEncoding(uri.url(QUrl::FullyEncoded | QUrl::RemoveScheme).toLatin1());
    QByteArrayView data = dataArray;

    // parse it:
    const qsizetype pos = data.indexOf(',');
    if (pos != -1) {
        payload = data.mid(pos + 1).toByteArray();
        data.truncate(pos);
        data = data.trimmed();

        // find out if the payload is encoded in Base64
        constexpr auto base64 = ";base64"_L1;
        if (QLatin1StringView{data}.endsWith(base64, Qt::CaseInsensitive)) {
            payload = QByteArray::fromBase64(payload);
            data.chop(base64.size());
        }

        QLatin1StringView textPlain;
        constexpr auto charset = "charset"_L1;
        if (QLatin1StringView{data}.startsWith(charset, Qt::CaseInsensitive)) {
            qsizetype i = charset.size();
            while (data.at(i) == ' ')
                ++i;
            if (data.at(i) == '=')
                textPlain = "text/plain;"_L1;
        }

        if (!data.isEmpty())
            mimeType = textPlain + QLatin1StringView(data.trimmed());
    }

    return true;
}